

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O0

void __thiscall
FGameConfigFile::CreateStandardAutoExec(FGameConfigFile *this,char *section,bool start)

{
  bool bVar1;
  char *value;
  FString local_28;
  FString path;
  bool start_local;
  char *section_local;
  FGameConfigFile *this_local;
  
  path.Chars._7_1_ = start;
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,section,false);
  if (!bVar1) {
    M_GetAutoexecPath();
    FConfigFile::SetSection(&this->super_FConfigFile,section,true);
    value = FString::GetChars(&local_28);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path",value,false);
    FString::~FString(&local_28);
  }
  if ((path.Chars._7_1_ & 1) != 0) {
    FConfigFile::MoveSectionToStart(&this->super_FConfigFile,section);
  }
  return;
}

Assistant:

void FGameConfigFile::CreateStandardAutoExec(const char *section, bool start)
{
	if (!SetSection(section))
	{
		FString path = M_GetAutoexecPath();
		SetSection (section, true);
		SetValueForKey ("Path", path.GetChars());
	}
	if (start)
	{
		MoveSectionToStart(section);
	}
}